

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t FNV32a(void *key,int len,uint32_t seed)

{
  uint uVar1;
  uint32_t h;
  ulong uVar2;
  
  uVar1 = seed ^ 0x811c9dc5;
  for (uVar2 = 0; (uint)(~(len >> 0x1f) & len) != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (uVar1 ^ *(byte *)((long)key + uVar2)) * 0x1000193;
  }
  return uVar1;
}

Assistant:

uint32_t
FNV32a(const void *key, int len, uint32_t seed)
{
  uint32_t h = seed;
  const uint8_t  *data = (const uint8_t *)key;

  h ^= UINT32_C(2166136261);
  for (int i = 0; i < len; i++) {
    h ^= data[i];
    h *= 16777619;
  }
  return h;
}